

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O2

string * __thiscall
lightconf::token_name_abi_cxx11_(string *__return_storage_ptr__,lightconf *this,token *tok)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  switch(*(undefined4 *)this) {
  case 0:
    pcVar1 = "<none>";
    break;
  case 1:
    pcVar1 = "string";
    break;
  case 2:
    pcVar1 = "identifier";
    break;
  case 3:
    pcVar1 = "number";
    break;
  case 4:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_30,'\x01');
    std::operator+(&local_50,"\'",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,"\'");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  case 5:
    pcVar1 = "whitespace";
    break;
  case 6:
    pcVar1 = "comment";
    break;
  case 7:
    pcVar1 = "eof";
    break;
  default:
    pcVar1 = "<unknown>";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::string token_name(const token& tok) {
    switch (tok.type) {
    case token_type::none_token: return "<none>";
    case token_type::identifier_token: return "identifier";
    case token_type::string_token: return "string";
    case token_type::number_token: return "number";
    case token_type::char_token: return "'" + std::string(1, tok.char_value) + "'";
    case token_type::comment_token: return "comment";
    case token_type::whitespace_token: return "whitespace";
    case token_type::eof_token: return "eof";
    default: return "<unknown>";
    }
}